

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_headers.c
# Opt level: O0

int test_long(void)

{
  __cl_long2 v2;
  cl_long16 b16;
  cl_long8 b8;
  cl_long4 b4;
  cl_long2 b2;
  cl_long b;
  cl_long16 a16;
  cl_long8 a8;
  cl_long4 a4;
  cl_long2 a2;
  cl_long a;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_208;
  undefined1 local_200 [192];
  undefined1 local_140 [64];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  
  local_c0 = 0;
  local_d0 = 0;
  local_c8 = 1;
  local_100 = 0;
  local_f8 = 1;
  local_f0 = 2;
  local_e8 = 3;
  memcpy(local_140,&DAT_00104140,0x40);
  memcpy(local_200,&DAT_00104180,0x80);
  local_208 = local_c0;
  local_220 = local_d0;
  uStack_218 = local_c8;
  local_240 = local_100;
  local_238 = local_f8;
  local_230 = local_f0;
  local_228 = local_e8;
  memcpy(&local_280,local_140,0x40);
  memcpy(&local_300,local_200,0x80);
  printf("\nVerifying assignment:\n");
  printf("b:   %ld\n",local_208);
  printf("b2:  %ld %ld \n",local_220,uStack_218);
  printf("b4:  %ld %ld %ld %ld\n",local_240,local_238,local_230,local_228);
  printf("b8:  %ld %ld %ld %ld %ld %ld %ld %ld\n",local_280,local_278,local_270,local_268,local_260,
         local_258,local_250,local_248);
  printf("b16: %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld %ld\n",local_300,
         local_2f8,local_2f0,local_2e8,local_2e0,local_2d8,local_2d0,local_2c8,local_2c0,local_2b8,
         local_2b0,local_2a8,local_2a0,local_298,local_290,local_288);
  printf("\nVerifying vector access:\n");
  printf("__cl_long2:  %ld %ld \n",local_220,uStack_218);
  printf("__cl_long4 SIMD vectors not supported on this architecture.\n");
  printf("__cl_long8 SIMD vectors not supported on this architecture.\n");
  printf("__cl_long16 SIMD vectors not supported on this architecture.\n");
  printf("\n");
  return 0;
}

Assistant:

int test_long(void)
{
/* long */
    /* Constructor */
    cl_long a = 0;
    cl_long2 a2 = {{ 0, 1 }};
    cl_long4 a4 = {{ 0, 1, 2, 3 }};
    cl_long8 a8 = {{ 0, 1, 2, 3, 4, 5, 6, 7 }};
    cl_long16 a16 = {{ 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 }};

    /* assignment */
    cl_long    b = a;
    cl_long2   b2 = a2;
    cl_long4   b4 = a4;
    cl_long8   b8 = a8;
    cl_long16  b16 = a16;

    printf("\nVerifying assignment:\n" );
    printf("b:   %" PRId64 "\n", b );
    printf("b2:  %" PRId64 " %" PRId64 " \n", b2.s[0], b2.s[1] );
    printf("b4:  %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 "\n", b4.s[0], b4.s[1], b4.s[2], b4.s[3] );
    printf("b8:  %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 "\n", b8.s[0], b8.s[1], b8.s[2], b8.s[3], b8.s[4], b8.s[5], b8.s[6], b8.s[7] );
    printf("b16: %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 "\n", b16.s[0], b16.s[1], b16.s[2], b16.s[3], b16.s[4], b16.s[5], b16.s[6], b16.s[7],
                                                                     b16.s[8], b16.s[9], b16.s[10], b16.s[11], b16.s[12], b16.s[13], b16.s[14], b16.s[15]);

    /* vector access */
    printf("\nVerifying vector access:\n" );
#if defined( __CL_LONG2__ )
    __cl_long2 v2 = b2.v2;
    printf("__cl_long2:  %" PRId64 " %" PRId64 " \n", ((cl_long*)&v2)[0], ((cl_long*)&v2)[1] );
#else
    printf( "__cl_long2 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_LONG4__ )
    __cl_long4 v4 = b4.v4;
    printf("__cl_long4:  %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " \n", ((cl_long*)&v4)[0], ((cl_long*)&v4)[1], ((cl_long*)&v4)[2], ((cl_long*)&v4)[3] );
#else
    printf( "__cl_long4 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_LONG8__ )
    __cl_long8 v8 = b8.v8;
    printf("__cl_long8:  %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " \n", ((cl_long*)&v8)[0], ((cl_long*)&v8)[1], ((cl_long*)&v8)[2], ((cl_long*)&v8)[3], ((cl_long*)&v8)[4], ((cl_long*)&v8)[5], ((cl_long*)&v8)[6], ((cl_long*)&v8)[7] );
#else
    printf( "__cl_long8 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_LONG16__ )
    __cl_long16 v16 = b16.v16;
    printf("__cl_long16: %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " %" PRId64 " \n", ((cl_long*)&v16)[0], ((cl_long*)&v16)[1], ((cl_long*)&v16)[2], ((cl_long*)&v16)[3], ((cl_long*)&v16)[4], ((cl_long*)&v16)[5], ((cl_long*)&v16)[6], ((cl_long*)&v16)[7],
                                                                      ((cl_long*)&v16)[8], ((cl_long*)&v16)[9], ((cl_long*)&v16)[10], ((cl_long*)&v16)[11], ((cl_long*)&v16)[12], ((cl_long*)&v16)[13], ((cl_long*)&v16)[14], ((cl_long*)&v16)[15]);
#else
    printf( "__cl_long16 SIMD vectors not supported on this architecture.\n" );
#endif

    printf( "\n" );
    return 0;
}